

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O1

bool caffe::NetNeedsDataUpgrade(NetParameter *net_param)

{
  RepeatedPtrField<caffe::V1LayerParameter> *this;
  int iVar1;
  HasBits<1UL> HVar2;
  Type *pTVar3;
  bool bVar4;
  int iVar5;
  DataParameter *from;
  ImageDataParameter *from_00;
  WindowDataParameter *from_01;
  DataParameter layer_param;
  WindowDataParameter WStack_88;
  
  iVar5 = (net_param->layers_).super_RepeatedPtrFieldBase.current_size_;
  bVar4 = 0 < iVar5;
  if (0 < iVar5) {
    this = &net_param->layers_;
    iVar5 = 0;
    do {
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                         (&this->super_RepeatedPtrFieldBase,iVar5);
      if (pTVar3->type_ == 5) {
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                           (&this->super_RepeatedPtrFieldBase,iVar5);
        from = pTVar3->data_param_;
        if (from == (DataParameter *)0x0) {
          from = (DataParameter *)&_DataParameter_default_instance_;
        }
        DataParameter::DataParameter((DataParameter *)&WStack_88,from);
        HVar2.has_bits_[0] = WStack_88._has_bits_.has_bits_[0];
        if (((uint)WStack_88._has_bits_.has_bits_[0] & 0x10a) != 0) {
          DataParameter::~DataParameter((DataParameter *)&WStack_88);
          return bVar4;
        }
        DataParameter::~DataParameter((DataParameter *)&WStack_88);
        if (((uint)HVar2.has_bits_[0] & 0x20) != 0) {
          return bVar4;
        }
      }
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                         (&this->super_RepeatedPtrFieldBase,iVar5);
      if (pTVar3->type_ == 0xc) {
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                           (&this->super_RepeatedPtrFieldBase,iVar5);
        from_00 = pTVar3->image_data_param_;
        if (from_00 == (ImageDataParameter *)0x0) {
          from_00 = (ImageDataParameter *)&_ImageDataParameter_default_instance_;
        }
        ImageDataParameter::ImageDataParameter((ImageDataParameter *)&WStack_88,from_00);
        HVar2.has_bits_[0] = WStack_88._has_bits_.has_bits_[0];
        if (((uint)WStack_88._has_bits_.has_bits_[0] & 0x40a) != 0) {
          ImageDataParameter::~ImageDataParameter((ImageDataParameter *)&WStack_88);
          return bVar4;
        }
        ImageDataParameter::~ImageDataParameter((ImageDataParameter *)&WStack_88);
        if (((uint)HVar2.has_bits_[0] & 0x40) != 0) {
          return bVar4;
        }
      }
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                         (&this->super_RepeatedPtrFieldBase,iVar5);
      if (pTVar3->type_ == 0x18) {
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                           (&this->super_RepeatedPtrFieldBase,iVar5);
        from_01 = pTVar3->window_data_param_;
        if (from_01 == (WindowDataParameter *)0x0) {
          from_01 = (WindowDataParameter *)&_WindowDataParameter_default_instance_;
        }
        WindowDataParameter::WindowDataParameter(&WStack_88,from_01);
        HVar2.has_bits_[0] = WStack_88._has_bits_.has_bits_[0];
        if (((uint)WStack_88._has_bits_.has_bits_[0] & 0x222) != 0) {
          WindowDataParameter::~WindowDataParameter(&WStack_88);
          return bVar4;
        }
        WindowDataParameter::~WindowDataParameter(&WStack_88);
        if (((uint)HVar2.has_bits_[0] & 0x40) != 0) {
          return bVar4;
        }
      }
      iVar5 = iVar5 + 1;
      iVar1 = (net_param->layers_).super_RepeatedPtrFieldBase.current_size_;
      bVar4 = iVar5 < iVar1;
    } while (iVar5 < iVar1);
  }
  return bVar4;
}

Assistant:

bool NetNeedsDataUpgrade(const NetParameter& net_param) {
  for (int i = 0; i < net_param.layers_size(); ++i) {
    if (net_param.layers(i).type() == V1LayerParameter_LayerType_DATA) {
      DataParameter layer_param = net_param.layers(i).data_param();
      if (layer_param.has_scale()) { return true; }
      if (layer_param.has_mean_file()) { return true; }
      if (layer_param.has_crop_size()) { return true; }
      if (layer_param.has_mirror()) { return true; }
    }
    if (net_param.layers(i).type() == V1LayerParameter_LayerType_IMAGE_DATA) {
      ImageDataParameter layer_param = net_param.layers(i).image_data_param();
      if (layer_param.has_scale()) { return true; }
      if (layer_param.has_mean_file()) { return true; }
      if (layer_param.has_crop_size()) { return true; }
      if (layer_param.has_mirror()) { return true; }
    }
    if (net_param.layers(i).type() == V1LayerParameter_LayerType_WINDOW_DATA) {
      WindowDataParameter layer_param = net_param.layers(i).window_data_param();
      if (layer_param.has_scale()) { return true; }
      if (layer_param.has_mean_file()) { return true; }
      if (layer_param.has_crop_size()) { return true; }
      if (layer_param.has_mirror()) { return true; }
    }
  }
  return false;
}